

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Ndr_Data_t *p_01;
  uchar *puVar7;
  uint *puVar8;
  int *piVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  int unaff_R13D;
  int iVar13;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int local_6c;
  Vec_Int_t *pVVar14;
  int Output;
  Vec_Int_t *local_38;
  
  pVVar4 = Vec_IntAlloc(100);
  p = Vec_IntAlloc(100);
  pVVar5 = Vec_IntAlloc(100);
  pVVar6 = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntEntry(vBuffer,0);
  if (iVar1 != 1) {
    __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0xeb,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
  }
  pVVar11 = (Vec_Int_t *)0x0;
  for (iVar1 = 2; iVar1 < vBuffer->nSize; iVar1 = iVar1 + 1) {
    unaff_R13D = Vec_IntEntry(vBuffer,iVar1);
    if (pVVar11 == (Vec_Int_t *)0x0 && 0xd < unaff_R13D) {
      pVVar12 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar12 = pVVar4;
      switch(unaff_R13D) {
      case 2:
        goto switchD_00325060_caseD_2;
      case 3:
        break;
      case 4:
        pVVar12 = p;
        break;
      case 5:
        pVVar12 = pVVar5;
        break;
      default:
        if (unaff_R13D - 6U < 8) {
          pVVar11 = pVVar6;
          Vec_IntPush(pVVar6,unaff_R13D);
          pVVar14 = p_00;
          Vec_IntPush(pVVar6,p_00->nSize);
          pVVar12 = p_00;
          pVVar6 = pVVar11;
          p_00 = pVVar14;
        }
        else {
          Vec_IntPush(pVVar11,unaff_R13D);
          pVVar12 = pVVar11;
        }
      }
    }
    pVVar11 = pVVar12;
  }
switchD_00325060_caseD_2:
  local_6c = unaff_R13D;
  pVVar11 = pVVar6;
  local_38 = pVVar4;
  Vec_IntPush(pVVar6,-1);
  Vec_IntPush(pVVar6,p_00->nSize);
  uVar2 = Vec_IntEntry(vBuffer,1);
  p_01 = (Ndr_Data_t *)malloc(0x18);
  p_01->nCap = 0x10;
  puVar7 = (uchar *)malloc(0x10);
  p_01->pHead = puVar7;
  puVar8 = (uint *)malloc(0x100);
  p_01->pBody = puVar8;
  *puVar8 = 0;
  *puVar7 = '\x01';
  puVar7[1] = '\a';
  p_01->nSize = 2;
  puVar8[1] = uVar2;
  Ndr_DataAddTo(p_01,0,2);
  if (uVar2 == 0) {
    __assert_fail("Name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x20d,"void *Ndr_Create(int)");
  }
  iVar13 = 1;
  uVar2 = Vec_IntEntry(vBuffer,1);
  Ndr_DataResize(p_01,6);
  puVar7 = p_01->pHead;
  iVar1 = p_01->nSize;
  puVar7[iVar1] = '\x02';
  puVar8 = p_01->pBody;
  puVar8[iVar1] = 0;
  puVar7[(long)iVar1 + 1] = '\a';
  p_01->nSize = iVar1 + 2U;
  puVar8[(long)iVar1 + 1] = uVar2;
  Ndr_DataAddTo(p_01,2,iVar1);
  iVar10 = 0;
  Ndr_DataAddTo(p_01,0,iVar1);
  pVVar6 = local_38;
  if (*puVar8 != iVar1 + 2U) {
    __assert_fail("(int)p->pBody[0] == p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x21c,"int Ndr_AddModule(void *, int)");
  }
  Ndr_DataResize(p_01,local_38->nSize);
  for (; iVar10 < pVVar6->nSize; iVar10 = iVar10 + 1) {
    uVar2 = Vec_IntEntry(pVVar6,iVar10);
    iVar1 = p_01->nSize;
    p_01->pHead[iVar1] = '\x04';
    p_01->nSize = iVar1 + 1;
    p_01->pBody[iVar1] = uVar2;
  }
  Ndr_DataAddTo(p_01,2,pVVar6->nSize);
  Ndr_DataAddTo(p_01,0,pVVar6->nSize);
  Ndr_DataResize(p_01,p->nSize);
  for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
    uVar2 = Vec_IntEntry(p,iVar1);
    iVar10 = p_01->nSize;
    p_01->pHead[iVar10] = '\x05';
    p_01->nSize = iVar10 + 1;
    p_01->pBody[iVar10] = uVar2;
  }
  Ndr_DataAddTo(p_01,2,p->nSize);
  Ndr_DataAddTo(p_01,0,p->nSize);
  pVVar4 = pVVar5;
  Ndr_DataResize(p_01,pVVar5->nSize);
  iVar10 = 0;
  for (iVar1 = 0; iVar1 < pVVar5->nSize; iVar1 = iVar1 + 1) {
    uVar2 = Vec_IntEntry(pVVar5,iVar1);
    pVVar5 = pVVar4;
    iVar3 = Acb_WireIsTarget(uVar2,pNames);
    if (iVar3 != 0) {
      iVar3 = p_01->nSize;
      p_01->pHead[iVar3] = '\n';
      p_01->nSize = iVar3 + 1;
      p_01->pBody[iVar3] = uVar2;
      iVar10 = iVar10 + 1;
    }
    pVVar4 = pVVar5;
  }
  Ndr_DataAddTo(p_01,2,iVar10);
  Ndr_DataAddTo(p_01,0,iVar10);
  for (iVar1 = 0; iVar10 = (int)pNames, iVar1 < pVVar6->nSize; iVar1 = iVar1 + 1) {
    local_6c = Vec_IntEntry(pVVar6,iVar1);
    Ndr_AddObject(p_01,0x102,3,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar11->nCap,iVar10,&p_00->nCap,(char *)pVVar4);
  }
  local_6c = Abc_NamStrFind(pNames,"1\'b0");
  if (local_6c != 0) {
    Ndr_AddObject(p_01,0x102,7,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar11->nCap,iVar10,&p_00->nCap,(char *)pVVar4);
  }
  local_6c = Abc_NamStrFind(pNames,"1\'b1");
  pVVar6 = pVVar11;
  if (local_6c != 0) {
    Ndr_AddObject(p_01,0x102,8,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar11->nCap,iVar10,&p_00->nCap,(char *)pVVar4);
  }
  iVar1 = pVVar11->nSize;
  pVVar5 = p_00;
  do {
    if (iVar1 <= iVar13) {
      for (iVar13 = 0; iVar13 < p->nSize; iVar13 = iVar13 + 1) {
        local_6c = Vec_IntEntry(p,iVar13);
        Ndr_AddObject(p_01,0x102,4,1,(int)&local_6c,(int)&local_6c,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff90,&pVVar6->nCap,iVar1,&pVVar5->nCap,(char *)pVVar4);
      }
      Vec_IntFree(local_38);
      Vec_IntFree(p);
      Vec_IntFree(pVVar4);
      Vec_IntFree(pVVar6);
      Vec_IntFree(pVVar5);
      return p_01;
    }
    iVar10 = Vec_IntEntry(pVVar11,iVar13 + -1);
    uVar2 = Vec_IntEntry(pVVar11,iVar13);
    if (0 < iVar10) {
      Output = Vec_IntEntry(p_00,uVar2);
      iVar3 = Vec_IntEntry(pVVar11,iVar13 + 2);
      piVar9 = Vec_IntEntryP(p_00,uVar2 + 1);
      if (7 < iVar10 - 6U) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x56,"int Acb_Type2Oper(int)");
      }
      pVVar11 = pVVar6;
      Ndr_AddObject(p_01,0x102,iVar10 + 5,iVar3 + ~uVar2,(int)piVar9,(int)&Output,
                    in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,&pVVar6->nCap,iVar1,
                    &pVVar5->nCap,(char *)pVVar4);
      pVVar6 = pVVar11;
    }
    iVar13 = iVar13 + 2;
  } while( true );
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            //char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            //if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
            //    i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = (Ndr_Data_t *)Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}